

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O0

void __thiscall
NDeviceChannel::serialize<cereal::PortableBinaryOutputArchive>
          (NDeviceChannel *this,PortableBinaryOutputArchive *archive)

{
  int *in_RDI;
  int *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000018;
  OutputArchive<cereal::PortableBinaryOutputArchive,_1U> *in_stack_00000020;
  int *in_stack_00000030;
  
  cereal::OutputArchive<cereal::PortableBinaryOutputArchive,1u>::operator()
            (in_stack_00000020,in_stack_00000018,(int *)this,(int *)archive,unaff_retaddr,in_RDI,
             in_stack_00000030);
  return;
}

Assistant:

void serialize(Archive &archive){
        archive(id, startByte, startBit, type, interleavedDataByte, interleavedDataBit);
    }